

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postscript.h
# Opt level: O1

void __thiscall Gecko::PostScript::edge(PostScript *this,Float xi,Float xj,Float weight,bool top)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = (double)ABS(xj - xi) * 0.5;
  dVar5 = dVar3 * dVar3;
  dVar4 = (dVar3 + dVar3 + -1.0) * dVar5;
  dVar3 = 100000.0;
  if (dVar4 <= 100000.0) {
    dVar3 = dVar4;
  }
  dVar5 = (dVar5 / dVar3) * (dVar5 / dVar3) + dVar5;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  fVar1 = xj;
  fVar2 = xi;
  if (!top) {
    dVar3 = -dVar3;
    fVar1 = xi;
    fVar2 = xj;
  }
  fprintf((FILE *)this->file,"%g 0 %g %g %g 0 %g %g A\n",(double)fVar1,(double)((xi + xj) * 0.5),
          dVar3,(double)fVar2,dVar5,(double)(weight * 0.25));
  return;
}

Assistant:

void edge(Float xi, Float xj, Float weight, bool top)
  {
    double x = (xi + xj) / 2;
    double d = fabs(xj - xi) / 2;
    double h = std::min(d * d * (2 * d - 1), 1e5);
    double y = d * d / h;
    double r = sqrt(d * d + y * y);
    weight /= 4;
    if (top)
      fprintf(file, "%g 0 %g %g %g 0 %g %g A\n", xj, x, +h, xi, r, weight);
    else
      fprintf(file, "%g 0 %g %g %g 0 %g %g A\n", xi, x, -h, xj, r, weight);
  }